

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RecordErrorOffsetOfExpr(sqlite3 *db,Expr *pExpr)

{
  bool bVar1;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  pExpr_local = pExpr;
  while( true ) {
    bVar1 = false;
    if ((pExpr_local != (Expr *)0x0) && (bVar1 = true, (pExpr_local->flags & 3) == 0)) {
      bVar1 = (pExpr_local->w).iJoin < 1;
    }
    if (!bVar1) break;
    pExpr_local = pExpr_local->pLeft;
  }
  if ((pExpr_local != (Expr *)0x0) && ((pExpr_local->flags & 0x40000000) == 0)) {
    db->errByteOffset = (int)pExpr_local->w;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RecordErrorOffsetOfExpr(sqlite3 *db, const Expr *pExpr){
  while( pExpr
     && (ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) || pExpr->w.iOfst<=0)
  ){
    pExpr = pExpr->pLeft;
  }
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromDDL) ) return;
  db->errByteOffset = pExpr->w.iOfst;
}